

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O1

int nonblankrange(char *str,int start,int len)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = str;
  if (0 < start) {
    pcVar3 = str + (uint)start;
    lVar4 = 0;
    do {
      if (str[lVar4] == '\0') {
        return 0;
      }
      lVar4 = lVar4 + 1;
    } while (start != (int)lVar4);
  }
  if (0 < len) {
    lVar4 = 0;
    do {
      cVar1 = pcVar3[lVar4];
      if ((long)cVar1 == 0) {
        return 0;
      }
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (len != (int)lVar4);
  }
  return 0;
}

Assistant:

int nonblankrange(char *str, int start, int len) {
   register int i;

   for(i = 0; i < start; i++) {
      if (*str++ == '\0')   { return 0; }
   }
   for(i = 0; i < len; i++) {
      if (*str == '\0')     { break; }
      if (! isspace(*str))  { return 1; }
      str++;
   }
   return 0;
}